

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForestNoNZ
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *vec)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pnVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  type_conflict5 tVar8;
  long lVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  int *piVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  long lVar13;
  int iVar14;
  byte bVar15;
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar15 = 0;
  pnVar4 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = (this->l).idx;
  piVar6 = (this->l).row;
  piVar7 = (this->l).start;
  iVar1 = (this->l).firstUpdate;
  lVar9 = (long)(this->l).firstUnused;
  while (lVar13 = lVar9, lVar9 = 0x1c, iVar1 < lVar13) {
    iVar2 = piVar6[lVar13 + -1];
    pnVar12 = vec + iVar2;
    pcVar10 = &local_b0;
    for (; lVar9 != 0; lVar9 = lVar9 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar10->data)->data)._M_elems[0] =
           (pnVar12->m_backend).data._M_elems[0];
      pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar12 + ((ulong)bVar15 * -2 + 1) * 4);
      pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + ((ulong)bVar15 * -2 + 1) * 4);
    }
    local_b0.exp = vec[iVar2].m_backend.exp;
    local_b0.neg = vec[iVar2].m_backend.neg;
    local_b0.fpclass = vec[iVar2].m_backend.fpclass;
    local_b0.prec_elem = vec[iVar2].m_backend.prec_elem;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    tVar8 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_b0,(double *)&local_138);
    lVar9 = lVar13 + -1;
    if (tVar8) {
      iVar2 = piVar7[lVar13 + -1];
      piVar11 = piVar5 + iVar2;
      pcVar10 = &pnVar4[iVar2].m_backend;
      for (iVar14 = piVar7[lVar13]; iVar2 < iVar14; iVar14 = iVar14 + -1) {
        local_138.fpclass = cpp_dec_float_finite;
        local_138.prec_elem = 0x1c;
        local_138.data._M_elems[0] = 0;
        local_138.data._M_elems[1] = 0;
        local_138.data._M_elems[2] = 0;
        local_138.data._M_elems[3] = 0;
        local_138.data._M_elems[4] = 0;
        local_138.data._M_elems[5] = 0;
        local_138.data._M_elems[6] = 0;
        local_138.data._M_elems[7] = 0;
        local_138.data._M_elems[8] = 0;
        local_138.data._M_elems[9] = 0;
        local_138.data._M_elems[10] = 0;
        local_138.data._M_elems[0xb] = 0;
        local_138.data._M_elems[0xc] = 0;
        local_138.data._M_elems[0xd] = 0;
        local_138.data._M_elems[0xe] = 0;
        local_138.data._M_elems[0xf] = 0;
        local_138.data._M_elems[0x10] = 0;
        local_138.data._M_elems[0x11] = 0;
        local_138.data._M_elems[0x12] = 0;
        local_138.data._M_elems[0x13] = 0;
        local_138.data._M_elems[0x14] = 0;
        local_138.data._M_elems[0x15] = 0;
        local_138.data._M_elems[0x16] = 0;
        local_138.data._M_elems[0x17] = 0;
        local_138.data._M_elems[0x18] = 0;
        local_138.data._M_elems[0x19] = 0;
        local_138.data._M_elems._104_5_ = 0;
        local_138.data._M_elems[0x1b]._1_3_ = 0;
        local_138.exp = 0;
        local_138.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_138,&local_b0,pcVar10);
        iVar3 = *piVar11;
        piVar11 = piVar11 + 1;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&vec[iVar3].m_backend,&local_138);
        pcVar10 = pcVar10 + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleftForestNoNZ(R* vec)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;
   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         assert(i >= 0 && i < l.size);
         k = lbeg[i];
         assert(k >= 0 && k < l.size);
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
         {
            assert(*idx >= 0 && *idx < thedim);
            vec[*idx++] -= x * (*val++);
         }
      }
   }
}